

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  Fts3Table *in_RCX;
  int *in_RDX;
  Fts3Table *in_RSI;
  sqlite3_value *in_RDI;
  long in_FS_OFFSET;
  sqlite3_value *in_stack_00000008;
  int isEmpty;
  int bFound;
  int rc;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  int iVar2;
  int *pRC;
  
  pRC = *(int **)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  iVar1 = 0;
  fts3DeleteTerms(pRC,in_RSI,in_stack_00000008,(u32 *)0x0,
                  (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((iVar1 != 0) && (iVar2 == 0)) {
    iVar1 = 0;
    iVar2 = fts3IsEmpty(in_RCX,in_RDI,
                        (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar2 == 0) {
      if (iVar1 == 0) {
        *in_RDX = *in_RDX + -1;
        if (in_RDI[1].db == (sqlite3 *)0x0) {
          fts3SqlExec(in_RDX,in_RCX,in_stack_ffffffffffffffc4,
                      (sqlite3_value **)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        }
        if (*(char *)((long)&in_RDI[8].z + 6) != '\0') {
          fts3SqlExec(in_RDX,in_RCX,in_stack_ffffffffffffffc4,
                      (sqlite3_value **)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        }
      }
      else {
        iVar2 = fts3DeleteAll((Fts3Table *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffbc);
        *in_RDX = 0;
        memset(in_RCX,0,(long)(*(int *)&in_RDI->xDel + 1) << 3);
      }
    }
  }
  if (*(int **)(in_FS_OFFSET + 0x28) != pRC) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p,
  sqlite3_value *pRowid,
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}